

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O2

void xmlFreeTextWriterNsStackEntry(xmlLinkPtr lk)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)xmlLinkGetData(lk);
  if (puVar1 != (undefined8 *)0x0) {
    if ((void *)*puVar1 != (void *)0x0) {
      (*xmlFree)((void *)*puVar1);
    }
    if ((void *)puVar1[1] != (void *)0x0) {
      (*xmlFree)((void *)puVar1[1]);
    }
    (*xmlFree)(puVar1);
    return;
  }
  return;
}

Assistant:

static void
xmlFreeTextWriterNsStackEntry(xmlLinkPtr lk)
{
    xmlTextWriterNsStackEntry *p;

    p = (xmlTextWriterNsStackEntry *) xmlLinkGetData(lk);
    if (p == 0)
        return;

    if (p->prefix != 0)
        xmlFree(p->prefix);
    if (p->uri != 0)
        xmlFree(p->uri);

    xmlFree(p);
}